

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_constrained_multi_parallelogram_encoder.h
# Opt level: O3

void __thiscall
draco::
MeshPredictionSchemeConstrainedMultiParallelogramEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::MeshPredictionSchemeConstrainedMultiParallelogramEncoder
          (MeshPredictionSchemeConstrainedMultiParallelogramEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,PointAttribute *attribute,
          PredictionSchemeWrapEncodingTransform<int,_int> *transform,
          MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *mesh_data)

{
  CornerTable *pCVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  (this->
  super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ).super_PredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>_>.
  super_PredictionSchemeTypedEncoderInterface<int,_int>.super_PredictionSchemeEncoderInterface.
  super_PredictionSchemeInterface._vptr_PredictionSchemeInterface =
       (_func_int **)&PTR__PredictionSchemeEncoder_001ddb60;
  (this->
  super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ).super_PredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>_>.
  attribute_ = attribute;
  iVar4 = (transform->super_PredictionSchemeWrapTransformBase<int>).min_value_;
  iVar5 = (transform->super_PredictionSchemeWrapTransformBase<int>).max_value_;
  iVar6 = (transform->super_PredictionSchemeWrapTransformBase<int>).max_dif_;
  (this->
  super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ).super_PredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>_>.
  transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_ =
       (transform->super_PredictionSchemeWrapTransformBase<int>).num_components_;
  (this->
  super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ).super_PredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>_>.
  transform_.super_PredictionSchemeWrapTransformBase<int>.min_value_ = iVar4;
  (this->
  super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ).super_PredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>_>.
  transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_ = iVar5;
  (this->
  super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ).super_PredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>_>.
  transform_.super_PredictionSchemeWrapTransformBase<int>.max_dif_ = iVar6;
  iVar4 = (transform->super_PredictionSchemeWrapTransformBase<int>).min_correction_;
  (this->
  super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ).super_PredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>_>.
  transform_.super_PredictionSchemeWrapTransformBase<int>.max_correction_ =
       (transform->super_PredictionSchemeWrapTransformBase<int>).max_correction_;
  (this->
  super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ).super_PredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>_>.
  transform_.super_PredictionSchemeWrapTransformBase<int>.min_correction_ = iVar4;
  std::vector<int,_std::allocator<int>_>::vector
            (&(this->
              super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
              ).
              super_PredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>_>
              .transform_.super_PredictionSchemeWrapTransformBase<int>.clamped_value_,
             &(transform->super_PredictionSchemeWrapTransformBase<int>).clamped_value_);
  (this->
  super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ).super_PredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>_>.
  super_PredictionSchemeTypedEncoderInterface<int,_int>.super_PredictionSchemeEncoderInterface.
  super_PredictionSchemeInterface._vptr_PredictionSchemeInterface =
       (_func_int **)&PTR__PredictionSchemeEncoder_001ddaf0;
  pCVar1 = mesh_data->corner_table_;
  pvVar2 = mesh_data->vertex_to_data_map_;
  pvVar3 = mesh_data->data_to_corner_map_;
  (this->
  super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ).mesh_data_.mesh_ = mesh_data->mesh_;
  (this->
  super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ).mesh_data_.corner_table_ = pCVar1;
  (this->
  super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ).mesh_data_.vertex_to_data_map_ = pvVar2;
  (this->
  super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ).mesh_data_.data_to_corner_map_ = pvVar3;
  (this->
  super_MeshPredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ).super_PredictionSchemeEncoder<int,_draco::PredictionSchemeWrapEncodingTransform<int,_int>_>.
  super_PredictionSchemeTypedEncoderInterface<int,_int>.super_PredictionSchemeEncoderInterface.
  super_PredictionSchemeInterface._vptr_PredictionSchemeInterface =
       (_func_int **)&PTR__MeshPredictionSchemeConstrainedMultiParallelogramEncoder_001ddbd0;
  lVar7 = 0x80;
  do {
    *(undefined8 *)((long)this->is_crease_edge_ + lVar7 + -0x80) = 0;
    *(undefined4 *)((long)(this->is_crease_edge_ + -3) + lVar7) = 0;
    *(undefined8 *)((long)this->is_crease_edge_ + lVar7 + -0x70) = 0;
    *(undefined4 *)((long)this->is_crease_edge_ + lVar7 + -0x68) = 0;
    *(undefined8 *)((long)this->is_crease_edge_ + lVar7 + -0x60) = 0;
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0x120);
  this->selected_mode_ = OPTIMAL_MULTI_PARALLELOGRAM;
  ShannonEntropyTracker::ShannonEntropyTracker(&this->entropy_tracker_);
  (this->entropy_symbols_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entropy_symbols_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->entropy_symbols_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

MeshPredictionSchemeConstrainedMultiParallelogramEncoder(
      const PointAttribute *attribute, const TransformT &transform,
      const MeshDataT &mesh_data)
      : MeshPredictionSchemeEncoder<DataTypeT, TransformT, MeshDataT>(
            attribute, transform, mesh_data),
        selected_mode_(Mode::OPTIMAL_MULTI_PARALLELOGRAM) {}